

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

void __thiscall
amrex::DistributionMapping::RoundRobinProcessorMap
          (DistributionMapping *this,vector<long,_std::allocator<long>_> *wgts,int nprocs,bool sort)

{
  int extraout_EDX;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> LIpairV;
  pair<long,_int> local_40;
  
  Ref::clear((this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             (this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LIpairV.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (ulong)((long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar2 = (int)uVar3;
  std::vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::reserve
            (&LIpairV,(long)iVar2);
  uVar1 = 0;
  uVar3 = uVar3 & 0xffffffff;
  if (iVar2 < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    local_40.first =
         (wgts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_start[uVar1];
    local_40.second = (int)uVar1;
    std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
    emplace_back<std::pair<long,int>>
              ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&LIpairV,&local_40
              );
  }
  Sort(&LIpairV,true);
  RoundRobinDoIt(this,(int)((ulong)((long)(wgts->super__Vector_base<long,_std::allocator<long>_>).
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(wgts->super__Vector_base<long,_std::allocator<long>_>).
                                         _M_impl.super__Vector_impl_data._M_start) >> 3),
                 extraout_EDX,&LIpairV,sort);
  std::_Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~_Vector_base
            (&LIpairV.
              super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>);
  return;
}

Assistant:

void
DistributionMapping::RoundRobinProcessorMap (const std::vector<Long>& wgts,
                                             int nprocs, bool sort)
{
    BL_ASSERT(wgts.size() > 0);

    m_ref->clear();
    m_ref->m_pmap.resize(wgts.size());

    //
    // Create ordering of boxes from "heaviest" to "lightest".
    // When we round-robin the boxes we want to go from heaviest
    // to lightest box, starting from the CPU having the least
    // amount of FAB data to the one having the most.  This "should"
    // help even out the FAB data distribution when running on large
    // numbers of CPUs, where the lower levels of the calculation are
    // using RoundRobin to lay out fewer than NProc boxes across
    // the CPUs.
    //
    std::vector<LIpair> LIpairV;

    const int N = wgts.size();

    LIpairV.reserve(N);

    for (int i = 0; i < N; ++i)
    {
        LIpairV.push_back(LIpair(wgts[i],i));
    }

    Sort(LIpairV, true);

    RoundRobinDoIt(wgts.size(), nprocs, &LIpairV, sort);
}